

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_process_cod(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_dec_tile_t *pjVar1;
  jpc_dec_tile_t *tile;
  jpc_cod_t *cod;
  jpc_ms_t *ms_local;
  jpc_dec_t *dec_local;
  
  if (dec->state == 4) {
    jpc_dec_cp_setfromcod(dec->cp,&(ms->parms).cod);
  }
  else if (dec->state == 0x10) {
    pjVar1 = dec->curtile;
    if (pjVar1 == (jpc_dec_tile_t *)0x0) {
      return -1;
    }
    if (pjVar1->partno != 0) {
      return -1;
    }
    jpc_dec_cp_setfromcod(pjVar1->cp,&(ms->parms).cod);
  }
  return 0;
}

Assistant:

static int jpc_dec_process_cod(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_cod_t *cod = &ms->parms.cod;
	jpc_dec_tile_t *tile;

	switch (dec->state) {
	case JPC_MH:
		jpc_dec_cp_setfromcod(dec->cp, cod);
		break;
	case JPC_TPH:
		if (!(tile = dec->curtile)) {
			return -1;
		}
		if (tile->partno != 0) {
			return -1;
		}
		jpc_dec_cp_setfromcod(tile->cp, cod);
		break;
	}
	return 0;
}